

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

CURLcode cf_he_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  Curl_addrinfo **ppCVar1;
  uchar uVar2;
  byte bVar3;
  uint uVar4;
  void *pvVar5;
  long *plVar6;
  connectdata *pcVar7;
  curl_trc_feat *pcVar8;
  eyeballer *peVar9;
  undefined8 *puVar10;
  ConnectBits CVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined4 uVar14;
  undefined8 uVar15;
  undefined4 uVar16;
  undefined8 uVar17;
  undefined4 uVar18;
  CURLcode CVar19;
  CURLcode CVar20;
  timediff_t tVar21;
  Curl_addrinfo *pCVar22;
  Curl_addrinfo *pCVar23;
  int *piVar24;
  char *pcVar25;
  _Bool _Var26;
  Curl_addrinfo *pCVar27;
  Curl_addrinfo *addr;
  long lVar28;
  void *pvVar29;
  int added;
  int iVar30;
  bool bVar31;
  int iVar32;
  bool bVar33;
  curltime cVar34;
  curltime newer;
  curltime newer_00;
  curltime newer_01;
  curltime older;
  curltime older_00;
  curltime older_01;
  curltime older_02;
  int local_c4;
  char *disphost;
  int port;
  int is_ipv6;
  ip_quadruple ipquad;
  char *host;
  
  if ((cf->field_0x24 & 1) != 0) {
    *done = true;
    return CURLE_OK;
  }
  pvVar5 = cf->ctx;
  *done = false;
  iVar30 = *(int *)((long)pvVar5 + 0x18);
  if (iVar30 == 2) {
    *done = true;
    return CURLE_OK;
  }
  pvVar29 = pvVar5;
  if (iVar30 == 1) goto LAB_0011b2c1;
  if (iVar30 != 0) {
    return CURLE_OK;
  }
  plVar6 = *(long **)((long)pvVar5 + 0x10);
  pcVar7 = cf->conn;
  tVar21 = Curl_timeleft(data,(curltime *)0x0,true);
  if (tVar21 < 0) {
    Curl_failf(data,"Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }
  cVar34 = Curl_now();
  *(time_t *)((long)pvVar5 + 0x38) = cVar34.tv_sec;
  *(int *)((long)pvVar5 + 0x40) = cVar34.tv_usec;
  uVar2 = pcVar7->ip_version;
  pCVar22 = (Curl_addrinfo *)*plVar6;
  if (uVar2 == '\x01') {
    iVar30 = 2;
    for (; pCVar22 != (Curl_addrinfo *)0x0; pCVar22 = pCVar22->ai_next) {
      if (pCVar22->ai_family == 2) goto LAB_0011b119;
    }
LAB_0011b0ca:
    iVar32 = 0;
LAB_0011b115:
    pCVar23 = (Curl_addrinfo *)0x0;
    goto LAB_0011b11c;
  }
  if (uVar2 == '\x02') {
    iVar30 = 10;
    for (; pCVar22 != (Curl_addrinfo *)0x0; pCVar22 = pCVar22->ai_next) {
      if (pCVar22->ai_family == 10) goto LAB_0011b119;
    }
    goto LAB_0011b0ca;
  }
  iVar30 = 10;
  iVar32 = 2;
  pCVar23 = pCVar22;
  if (pCVar22 == (Curl_addrinfo *)0x0) goto LAB_0011b115;
  do {
    pCVar27 = pCVar22;
    if (pCVar23->ai_family == 10) goto LAB_0011b0f6;
    ppCVar1 = &pCVar23->ai_next;
    pCVar23 = *ppCVar1;
  } while (*ppCVar1 != (Curl_addrinfo *)0x0);
  pCVar23 = (Curl_addrinfo *)0x0;
LAB_0011b0f6:
  do {
    if (pCVar27->ai_family == 2) goto LAB_0011b11e;
    ppCVar1 = &pCVar27->ai_next;
    pCVar27 = *ppCVar1;
  } while (*ppCVar1 != (Curl_addrinfo *)0x0);
  if (pCVar23 == (Curl_addrinfo *)0x0) {
    iVar30 = pCVar22->ai_family;
    pCVar27 = (Curl_addrinfo *)0x0;
    pCVar23 = pCVar22;
    do {
      if (pCVar23->ai_family == iVar30) goto LAB_0011b11e;
      pCVar23 = pCVar23->ai_next;
    } while (pCVar23 != (Curl_addrinfo *)0x0);
    pCVar23 = (Curl_addrinfo *)0x0;
  }
  else {
    pCVar27 = (Curl_addrinfo *)0x0;
  }
LAB_0011b11e:
  bVar33 = pCVar23 == (Curl_addrinfo *)0x0;
  pCVar22 = pCVar27;
  if (bVar33) {
    pCVar22 = (Curl_addrinfo *)0x0;
  }
  addr = pCVar27;
  if (!bVar33 || pCVar27 == (Curl_addrinfo *)0x0) {
    addr = pCVar23;
  }
  if (addr == (Curl_addrinfo *)0x0) {
    return CURLE_COULDNT_CONNECT;
  }
  if (bVar33 && pCVar27 != (Curl_addrinfo *)0x0) {
    iVar30 = iVar32;
  }
  *(undefined8 *)((long)pvVar5 + 0x20) = 0;
  *(undefined8 *)((long)pvVar5 + 0x28) = 0;
  CVar19 = eyeballer_new((eyeballer **)((long)pvVar5 + 0x20),
                         *(cf_ip_connect_create **)((long)pvVar5 + 8),addr,iVar30,(eyeballer *)0x0,0
                         ,tVar21,EXPIRE_DNS_PER_NAME);
  if (CVar19 != CURLE_OK) {
    return CVar19;
  }
  if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
    pcVar8 = (data->state).feat;
    if (pcVar8 == (curl_trc_feat *)0x0) {
      if (cf != (Curl_cfilter *)0x0) goto LAB_0011b1d5;
    }
    else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar8->log_level)) {
LAB_0011b1d5:
      if (0 < cf->cft->log_level) {
        peVar9 = *(eyeballer **)((long)pvVar5 + 0x20);
        Curl_trc_cf_infof(data,cf,"created %s (timeout %ldms)",peVar9->name,peVar9->timeoutms);
      }
    }
  }
  if (pCVar22 != (Curl_addrinfo *)0x0) {
    CVar19 = eyeballer_new((eyeballer **)((long)pvVar5 + 0x28),
                           *(cf_ip_connect_create **)((long)pvVar5 + 8),pCVar22,iVar32,
                           *(eyeballer **)((long)pvVar5 + 0x20),
                           (ulong)(data->set).happy_eyeballs_timeout,tVar21,EXPIRE_DNS_PER_NAME2);
    if (CVar19 != CURLE_OK) {
      return CVar19;
    }
    if (((data->set).field_0x8cd & 0x10) != 0) {
      pcVar8 = (data->state).feat;
      if (pcVar8 == (curl_trc_feat *)0x0) {
        if (cf != (Curl_cfilter *)0x0) goto LAB_0011b26b;
      }
      else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar8->log_level)) {
LAB_0011b26b:
        if (0 < cf->cft->log_level) {
          peVar9 = *(eyeballer **)((long)pvVar5 + 0x28);
          Curl_trc_cf_infof(data,cf,"created %s (timeout %ldms)",peVar9->name,peVar9->timeoutms);
        }
      }
    }
    Curl_expire(data,(ulong)(data->set).happy_eyeballs_timeout,EXPIRE_HAPPY_EYEBALLS);
  }
  *(undefined4 *)((long)pvVar5 + 0x18) = 1;
  pvVar29 = cf->ctx;
LAB_0011b2c1:
  pcVar7 = cf->conn;
  do {
    *done = false;
    cVar34 = Curl_now();
    ipquad.remote_ip._0_8_ = cVar34.tv_sec;
    ipquad.remote_ip._8_4_ = cVar34.tv_usec;
    lVar28 = 0;
    local_c4 = 0;
    iVar30 = 0;
    bVar33 = true;
    do {
      bVar31 = bVar33;
      peVar9 = *(eyeballer **)((long)pvVar29 + lVar28 * 8 + 0x20);
      if ((peVar9 != (eyeballer *)0x0) && (bVar3 = peVar9->field_0x64, (bVar3 & 4) == 0)) {
        if ((bVar3 & 2) == 0) {
          iVar30 = iVar30 + 1;
        }
        else {
          _Var26 = (_Bool)(bVar3 >> 3 & 1);
          *done = _Var26;
          CVar19 = peVar9->result;
          if (CVar19 == CURLE_OK && _Var26 == false) {
            CVar19 = Curl_conn_cf_connect(peVar9->cf,data,false,done);
            peVar9->result = CVar19;
            if (CVar19 == CURLE_WEIRD_SERVER_REPLY) {
              peVar9->field_0x64 = peVar9->field_0x64 | 0x20;
              CVar19 = CURLE_WEIRD_SERVER_REPLY;
            }
            else if (CVar19 == CURLE_OK) {
              if (*done == true) {
                peVar9->field_0x64 = peVar9->field_0x64 | 0xc;
                CVar19 = CURLE_OK;
              }
              else {
                cVar34.tv_usec._0_1_ = ipquad.remote_ip[8];
                cVar34.tv_usec._1_1_ = ipquad.remote_ip[9];
                cVar34.tv_usec._2_1_ = ipquad.remote_ip[10];
                cVar34.tv_usec._3_1_ = ipquad.remote_ip[0xb];
                cVar34.tv_sec._0_1_ = ipquad.remote_ip[0];
                cVar34.tv_sec._1_1_ = ipquad.remote_ip[1];
                cVar34.tv_sec._2_1_ = ipquad.remote_ip[2];
                cVar34.tv_sec._3_1_ = ipquad.remote_ip[3];
                cVar34.tv_sec._4_1_ = ipquad.remote_ip[4];
                cVar34.tv_sec._5_1_ = ipquad.remote_ip[5];
                cVar34.tv_sec._6_1_ = ipquad.remote_ip[6];
                cVar34.tv_sec._7_1_ = ipquad.remote_ip[7];
                uVar13 = (peVar9->started).tv_sec;
                uVar14 = (peVar9->started).tv_usec;
                older.tv_usec = uVar14;
                older.tv_sec = uVar13;
                cVar34._12_4_ = 0;
                older._12_4_ = 0;
                tVar21 = Curl_timediff(cVar34,older);
                if (tVar21 < peVar9->timeoutms) {
                  CVar19 = peVar9->result;
                }
                else {
                  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                     ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar8->log_level)))) {
                    Curl_infof(data,"%s connect timeout after %ldms, move on!",peVar9->name);
                  }
                  peVar9->error = 0x6e;
                  CVar19 = CURLE_OPERATION_TIMEDOUT;
                }
              }
            }
          }
          peVar9->result = CVar19;
          if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
              ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 ||
               (0 < pcVar8->log_level)))) && (0 < cf->cft->log_level)) {
            Curl_trc_cf_infof(data,cf,"%s connect -> %d, connected=%d",peVar9->name,(ulong)CVar19,
                              (ulong)*done);
            CVar19 = peVar9->result;
          }
          if (CVar19 == CURLE_OK) {
            if (*done != false) {
              *(eyeballer **)((long)pvVar29 + 0x30) = peVar9;
              *(undefined8 *)((long)pvVar29 + lVar28 * 8 + 0x20) = 0;
              goto LAB_0011b73e;
            }
            local_c4 = local_c4 + 1;
          }
          else if ((peVar9->field_0x64 & 4) == 0) {
            iVar32 = peVar9->error;
            if (iVar32 != 0) {
              (data->state).os_errno = iVar32;
              piVar24 = __errno_location();
              *piVar24 = iVar32;
            }
            tVar21 = Curl_timeleft(data,(curltime *)&ipquad,true);
            if (cf->sockindex == 0) {
              pCVar22 = peVar9->addr;
              do {
                if ((pCVar22 == (Curl_addrinfo *)0x0) ||
                   (pCVar22 = pCVar22->ai_next, pCVar22 == (Curl_addrinfo *)0x0)) {
                  peVar9->addr = (Curl_addrinfo *)0x0;
                  if ((peVar9->field_0x64 & 0x20) != 0) {
                    peVar9->addr = peVar9->first;
                    peVar9->field_0x64 = (peVar9->field_0x64 & 0xde) + 1;
                  }
                  goto LAB_0011b4a0;
                }
              } while (pCVar22->ai_family != peVar9->ai_family);
              peVar9->addr = pCVar22;
LAB_0011b4a0:
              baller_start(cf,data,peVar9,tVar21);
              if ((peVar9->field_0x64 & 4) == 0) {
                if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                    ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 ||
                     (0 < pcVar8->log_level)))) && (0 < cf->cft->log_level)) {
                  Curl_trc_cf_infof(data,cf,"%s trying next",peVar9->name);
                }
                local_c4 = local_c4 + 1;
                Curl_expire(data,0,EXPIRE_RUN_NOW);
                goto LAB_0011b554;
              }
            }
            else {
              peVar9->field_0x64 = peVar9->field_0x64 & 0xf1 | 6;
              peVar9->result = CURLE_COULDNT_CONNECT;
              peVar9->error = 0;
            }
            if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
               (((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 ||
                 (0 < pcVar8->log_level)) && (0 < cf->cft->log_level)))) {
              Curl_trc_cf_infof(data,cf,"%s done",peVar9->name);
            }
          }
        }
      }
LAB_0011b554:
      lVar28 = 1;
      bVar33 = false;
    } while (bVar31);
    if (*(long *)((long)pvVar29 + 0x30) != 0) {
LAB_0011b73e:
      *done = true;
      *(undefined4 *)((long)pvVar5 + 0x18) = 2;
      cf->field_0x24 = cf->field_0x24 | 1;
      lVar28 = *(long *)((long)pvVar5 + 0x30);
      cf->next = *(Curl_cfilter **)(lVar28 + 0x28);
      *(undefined8 *)(lVar28 + 0x28) = 0;
      cf_he_ctx_clear((Curl_cfilter *)cf->ctx,data);
      if ((cf->conn->handler->protocol & 0x30) != 0) {
        Curl_pgrsTime(data,TIMER_APPCONNECT);
      }
      if (((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
           ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 || (0 < pcVar8->log_level))
           )) && ((((0 < cf->cft->log_level &&
                    (CVar19 = Curl_conn_cf_get_ip_info(cf->next,data,&is_ipv6,&ipquad),
                    CVar19 == CURLE_OK)) &&
                   ((*cf->next->cft->get_host)(cf->next,data,&host,&disphost,&port),
                   ((data->set).field_0x8cd & 0x10) != 0)) &&
                  ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 ||
                   (0 < pcVar8->log_level)))))) && (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"Connected to %s (%s) port %u",disphost,&ipquad,
                          (ulong)(uint)ipquad.remote_port);
      }
      plVar6 = &(data->info).numconnects;
      *plVar6 = *plVar6 + 1;
      goto LAB_0011b853;
    }
    if (local_c4 == 0 && iVar30 == 0) goto LAB_0011b85a;
    tVar21 = Curl_timeleft(data,(curltime *)&ipquad,true);
    if (tVar21 < 0) {
      newer_01.tv_usec._0_1_ = ipquad.remote_ip[8];
      newer_01.tv_usec._1_1_ = ipquad.remote_ip[9];
      newer_01.tv_usec._2_1_ = ipquad.remote_ip[10];
      newer_01.tv_usec._3_1_ = ipquad.remote_ip[0xb];
      newer_01.tv_sec._0_1_ = ipquad.remote_ip[0];
      newer_01.tv_sec._1_1_ = ipquad.remote_ip[1];
      newer_01.tv_sec._2_1_ = ipquad.remote_ip[2];
      newer_01.tv_sec._3_1_ = ipquad.remote_ip[3];
      newer_01.tv_sec._4_1_ = ipquad.remote_ip[4];
      newer_01.tv_sec._5_1_ = ipquad.remote_ip[5];
      newer_01.tv_sec._6_1_ = ipquad.remote_ip[6];
      newer_01.tv_sec._7_1_ = ipquad.remote_ip[7];
      uVar17 = (data->progress).t_startsingle.tv_sec;
      uVar18 = (data->progress).t_startsingle.tv_usec;
      older_02.tv_usec = uVar18;
      older_02.tv_sec = uVar17;
      newer_01._12_4_ = 0;
      older_02._12_4_ = 0;
      tVar21 = Curl_timediff(newer_01,older_02);
      Curl_failf(data,"Connection timeout after %ld ms",tVar21);
      return CURLE_OPERATION_TIMEDOUT;
    }
    if (iVar30 < 1) break;
    iVar30 = 0;
    lVar28 = 0;
    bVar33 = true;
    do {
      bVar31 = bVar33;
      peVar9 = *(eyeballer **)((long)pvVar29 + lVar28 * 8 + 0x20);
      if (((peVar9 != (eyeballer *)0x0) && ((peVar9->field_0x64 & 2) == 0)) &&
         (((peVar9->primary != (eyeballer *)0x0 && ((peVar9->primary->field_0x64 & 4) != 0)) ||
          (newer.tv_usec._0_1_ = ipquad.remote_ip[8], newer.tv_usec._1_1_ = ipquad.remote_ip[9],
          newer.tv_usec._2_1_ = ipquad.remote_ip[10], newer.tv_usec._3_1_ = ipquad.remote_ip[0xb],
          newer.tv_sec._0_1_ = ipquad.remote_ip[0], newer.tv_sec._1_1_ = ipquad.remote_ip[1],
          newer.tv_sec._2_1_ = ipquad.remote_ip[2], newer.tv_sec._3_1_ = ipquad.remote_ip[3],
          newer.tv_sec._4_1_ = ipquad.remote_ip[4], newer.tv_sec._5_1_ = ipquad.remote_ip[5],
          newer.tv_sec._6_1_ = ipquad.remote_ip[6], newer.tv_sec._7_1_ = ipquad.remote_ip[7],
          newer._12_4_ = 0, older_00._12_4_ = 0,
          older_00._0_12_ = *(undefined1 (*) [12])((long)pvVar29 + 0x38),
          tVar21 = Curl_timediff(newer,older_00), peVar9->delay_ms <= tVar21)))) {
        tVar21 = Curl_timeleft(data,(curltime *)&ipquad,true);
        baller_start(cf,data,peVar9,tVar21);
        if ((peVar9->field_0x64 & 4) == 0) {
          if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
              ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 ||
               (0 < pcVar8->log_level)))) && (0 < cf->cft->log_level)) {
            Curl_trc_cf_infof(data,cf,"%s starting (timeout=%ldms)",peVar9->name,peVar9->timeoutms);
          }
          local_c4 = local_c4 + 1;
          iVar30 = iVar30 + 1;
        }
        else if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                 ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar8->log_level)))) && (0 < cf->cft->log_level)) {
          Curl_trc_cf_infof(data,cf,"%s done",peVar9->name);
        }
      }
      lVar28 = 1;
      bVar33 = false;
    } while (bVar31);
  } while (0 < iVar30);
  if (local_c4 < 1) {
LAB_0011b85a:
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
        ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 || (0 < pcVar8->log_level))))
       && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"all eyeballers failed");
    }
    lVar28 = 0;
    bVar33 = true;
LAB_0011b8a4:
    do {
      bVar31 = bVar33;
      puVar10 = *(undefined8 **)((long)pvVar29 + lVar28 * 8 + 0x20);
      if (puVar10 != (undefined8 *)0x0) {
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
           (((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 || (0 < pcVar8->log_level)
             ) && (0 < cf->cft->log_level)))) {
          Curl_trc_cf_infof(data,cf,"%s assess started=%d, result=%d",*puVar10,
                            (ulong)(*(uint *)((long)puVar10 + 100) >> 1 & 1),
                            (ulong)*(uint *)((long)puVar10 + 0x5c));
        }
        if ((*(byte *)((long)puVar10 + 100) & 2) != 0) {
          CVar20 = *(CURLcode *)((long)puVar10 + 0x5c);
          lVar28 = 1;
          bVar33 = false;
          if (!(bool)(bVar31 & CVar20 == CURLE_OK)) {
            CVar19 = CURLE_COULDNT_CONNECT;
            if (CVar20 != CURLE_OK) {
              CVar19 = CVar20;
            }
            goto LAB_0011b940;
          }
          goto LAB_0011b8a4;
        }
      }
      lVar28 = 1;
      bVar33 = false;
    } while (bVar31);
    CVar19 = CURLE_COULDNT_CONNECT;
LAB_0011b940:
    CVar11 = pcVar7->bits;
    lVar28 = 0xb8;
    if (((((ulong)CVar11 & 2) == 0) && (lVar28 = 0xf0, ((ulong)CVar11 & 1) == 0)) &&
       (lVar28 = 0x98, (CVar11._0_4_ >> 8 & 1) == 0)) {
      lVar28 = 0x68;
    }
    uVar12 = *(undefined8 *)((long)&(pcVar7->cpool_node)._list + lVar28);
    uVar4 = (pcVar7->primary).remote_port;
    newer_00.tv_usec._0_1_ = ipquad.remote_ip[8];
    newer_00.tv_usec._1_1_ = ipquad.remote_ip[9];
    newer_00.tv_usec._2_1_ = ipquad.remote_ip[10];
    newer_00.tv_usec._3_1_ = ipquad.remote_ip[0xb];
    newer_00.tv_sec._0_1_ = ipquad.remote_ip[0];
    newer_00.tv_sec._1_1_ = ipquad.remote_ip[1];
    newer_00.tv_sec._2_1_ = ipquad.remote_ip[2];
    newer_00.tv_sec._3_1_ = ipquad.remote_ip[3];
    newer_00.tv_sec._4_1_ = ipquad.remote_ip[4];
    newer_00.tv_sec._5_1_ = ipquad.remote_ip[5];
    newer_00.tv_sec._6_1_ = ipquad.remote_ip[6];
    newer_00.tv_sec._7_1_ = ipquad.remote_ip[7];
    uVar15 = (data->progress).t_startsingle.tv_sec;
    uVar16 = (data->progress).t_startsingle.tv_usec;
    older_01.tv_usec = uVar16;
    older_01.tv_sec = uVar15;
    newer_00._12_4_ = 0;
    older_01._12_4_ = 0;
    tVar21 = Curl_timediff(newer_00,older_01);
    pcVar25 = curl_easy_strerror(CVar19);
    Curl_failf(data,"Failed to connect to %s port %u after %ld ms: %s",uVar12,(ulong)uVar4,tVar21,
               pcVar25);
    CVar20 = CURLE_OPERATION_TIMEDOUT;
    if ((data->state).os_errno != 0x6e) {
      CVar20 = CVar19;
    }
  }
  else {
    *done = false;
LAB_0011b853:
    CVar20 = CURLE_OK;
  }
  return CVar20;
LAB_0011b119:
  iVar32 = 0;
  pCVar23 = pCVar22;
LAB_0011b11c:
  pCVar27 = (Curl_addrinfo *)0x0;
  goto LAB_0011b11e;
}

Assistant:

static CURLcode cf_he_connect(struct Curl_cfilter *cf,
                              struct Curl_easy *data,
                              bool blocking, bool *done)
{
  struct cf_he_ctx *ctx = cf->ctx;
  CURLcode result = CURLE_OK;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  (void)blocking; /* TODO: do we want to support this? */
  DEBUGASSERT(ctx);
  *done = FALSE;

  switch(ctx->state) {
    case SCFST_INIT:
      DEBUGASSERT(CURL_SOCKET_BAD == Curl_conn_cf_get_socket(cf, data));
      DEBUGASSERT(!cf->connected);
      result = start_connect(cf, data, ctx->remotehost);
      if(result)
        return result;
      ctx->state = SCFST_WAITING;
      FALLTHROUGH();
    case SCFST_WAITING:
      result = is_connected(cf, data, done);
      if(!result && *done) {
        DEBUGASSERT(ctx->winner);
        DEBUGASSERT(ctx->winner->cf);
        DEBUGASSERT(ctx->winner->cf->connected);
        /* we have a winner. Install and activate it.
         * close/free all others. */
        ctx->state = SCFST_DONE;
        cf->connected = TRUE;
        cf->next = ctx->winner->cf;
        ctx->winner->cf = NULL;
        cf_he_ctx_clear(cf, data);

        if(cf->conn->handler->protocol & PROTO_FAMILY_SSH)
          Curl_pgrsTime(data, TIMER_APPCONNECT); /* we are connected already */
        if(Curl_trc_cf_is_verbose(cf, data)) {
          struct ip_quadruple ipquad;
          int is_ipv6;
          if(!Curl_conn_cf_get_ip_info(cf->next, data, &is_ipv6, &ipquad)) {
            const char *host, *disphost;
            int port;
            cf->next->cft->get_host(cf->next, data, &host, &disphost, &port);
            CURL_TRC_CF(data, cf, "Connected to %s (%s) port %u",
                        disphost, ipquad.remote_ip, ipquad.remote_port);
          }
        }
        data->info.numconnects++; /* to track the # of connections made */
      }
      break;
    case SCFST_DONE:
      *done = TRUE;
      break;
  }
  return result;
}